

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_ctrl.c
# Opt level: O0

int ENGINE_ctrl_cmd(ENGINE *e,char *cmd_name,long i,void *p,f *f,int cmd_optional)

{
  int iVar1;
  int num;
  int local_4;
  
  if ((e == (ENGINE *)0x0) || (cmd_name == (char *)0x0)) {
    ERR_new();
    ERR_set_debug((char *)i,(int)((ulong)p >> 0x20),(char *)f);
    ERR_set_error(0x26,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    if ((*(long *)(e + 0x70) != 0) && (iVar1 = ENGINE_ctrl(e,0xd,0,cmd_name,(f *)0x0), 0 < iVar1)) {
      iVar1 = ENGINE_ctrl(e,iVar1,i,p,f);
      if (0 < iVar1) {
        return 1;
      }
      return 0;
    }
    iVar1 = (int)((ulong)p >> 0x20);
    if (cmd_optional == 0) {
      ERR_new();
      ERR_set_debug((char *)i,iVar1,(char *)f);
      ERR_set_error(0x26,0x89,(char *)0x0);
      local_4 = 0;
    }
    else {
      ERR_clear_error();
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ENGINE_ctrl_cmd(ENGINE *e, const char *cmd_name,
                    long i, void *p, void (*f) (void), int cmd_optional)
{
    int num;

    if (e == NULL || cmd_name == NULL) {
        ERR_raise(ERR_LIB_ENGINE, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }
    if (e->ctrl == NULL
        || (num = ENGINE_ctrl(e, ENGINE_CTRL_GET_CMD_FROM_NAME,
                              0, (void *)cmd_name, NULL)) <= 0) {
        /*
         * If the command didn't *have* to be supported, we fake success.
         * This allows certain settings to be specified for multiple ENGINEs
         * and only require a change of ENGINE id (without having to
         * selectively apply settings). Eg. changing from a hardware device
         * back to the regular software ENGINE without editing the config
         * file, etc.
         */
        if (cmd_optional) {
            ERR_clear_error();
            return 1;
        }
        ERR_raise(ERR_LIB_ENGINE, ENGINE_R_INVALID_CMD_NAME);
        return 0;
    }
    /*
     * Force the result of the control command to 0 or 1, for the reasons
     * mentioned before.
     */
    if (ENGINE_ctrl(e, num, i, p, f) > 0)
        return 1;
    return 0;
}